

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

VP8StatusCode
ParseHeadersInternal
          (uint8_t *data,size_t data_size,int *width,int *height,int *has_alpha,int *has_animation,
          int *format,WebPHeaderStructure *headers)

{
  VP8StatusCode VVar1;
  uint uVar2;
  int iVar3;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  size_t *in_RSI;
  int *in_RDI;
  uint *in_R8;
  uint *in_R9;
  bool bVar4;
  undefined4 *in_stack_00000008;
  uint32_t flags;
  WebPHeaderStructure hdrs;
  VP8StatusCode status;
  int have_all_data;
  int animation_present;
  int found_vp8x;
  int found_riff;
  int image_height;
  int image_width;
  int canvas_height;
  int canvas_width;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar6;
  int *height_00;
  size_t *flags_ptr;
  uint8_t **in_stack_ffffffffffffff68;
  uint8_t **in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  size_t *in_stack_ffffffffffffff80;
  uint8_t **in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  VP8StatusCode local_5c;
  VP8StatusCode local_4;
  
  if (hdrs.data == (uint8_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(undefined4 *)(hdrs.data + 0x10);
  }
  if ((in_RDI == (int *)0x0) || (in_RSI < (size_t *)0xc)) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  memset(&stack0xffffffffffffff58,0,0x48);
  height_00 = in_RDI;
  flags_ptr = in_RSI;
  VVar1 = ParseRIFF(in_stack_ffffffffffffff68,in_RSI,(int)((ulong)in_RDI >> 0x20),
                    (size_t *)CONCAT44(in_stack_ffffffffffffff54,uVar5));
  if (VVar1 != VP8_STATUS_OK) {
    return VVar1;
  }
  bVar4 = in_stack_ffffffffffffff90 != 0;
  uVar6 = 0;
  VVar1 = ParseVP8X(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                    (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    (int *)in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68,
                    (uint32_t *)flags_ptr);
  if (VVar1 != VP8_STATUS_OK) {
    return VVar1;
  }
  uVar2 = (uint)((uVar6 & 2) != 0);
  if (in_R8 != (uint *)0x0) {
    *in_R8 = (uint)((uVar6 & 0x10) != 0);
  }
  if (in_R9 != (uint *)0x0) {
    *in_R9 = uVar2;
  }
  if (in_stack_00000008 != (undefined4 *)0x0) {
    *in_stack_00000008 = 0;
  }
  if (in_RSI < (size_t *)0x4) {
    local_5c = VP8_STATUS_NOT_ENOUGH_DATA;
  }
  else if ((((bVar4) || (*in_RDI != 0x48504c41)) ||
           (local_5c = ParseOptionalChunks(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                           CONCAT44(in_stack_ffffffffffffff7c,
                                                    in_stack_ffffffffffffff78),
                                           in_stack_ffffffffffffff70,
                                           (size_t *)in_stack_ffffffffffffff68),
           local_5c == VP8_STATUS_OK)) &&
          (local_5c = ParseVP8Header(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                     in_stack_ffffffffffffff7c,(size_t)in_stack_ffffffffffffff70,
                                     (size_t *)in_stack_ffffffffffffff68,(int *)flags_ptr),
          local_5c == VP8_STATUS_OK)) {
    if ((uint8_t **)0xfffffff6 < in_stack_ffffffffffffff88) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if ((in_stack_00000008 != (undefined4 *)0x0) && (uVar2 == 0)) {
      uVar5 = 1;
      if (in_stack_ffffffffffffff98 != 0) {
        uVar5 = 2;
      }
      *in_stack_00000008 = uVar5;
    }
    if (in_stack_ffffffffffffff98 == 0) {
      if (in_RSI < (size_t *)0xa) {
        local_5c = VP8_STATUS_NOT_ENOUGH_DATA;
        goto LAB_00117de1;
      }
      iVar3 = VP8GetInfo((uint8_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (size_t)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                         (int *)flags_ptr,height_00);
      if (iVar3 == 0) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
    }
    else {
      if (in_RSI < (size_t *)0x5) {
        local_5c = VP8_STATUS_NOT_ENOUGH_DATA;
        goto LAB_00117de1;
      }
      iVar3 = VP8LGetInfo((uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,
                          (int *)in_stack_ffffffffffffff80,
                          (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (iVar3 == 0) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
    }
    if (hdrs.data != (uint8_t *)0x0) {
      memcpy(hdrs.data,&stack0xffffffffffffff58,0x48);
      *(long *)(hdrs.data + 0x18) = (long)in_RDI - *(long *)hdrs.data;
    }
  }
LAB_00117de1:
  if (local_5c == VP8_STATUS_OK) {
    if (in_R8 != (uint *)0x0) {
      *in_R8 = (uint)(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78) != 0) | *in_R8;
    }
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = 0;
    }
    local_4 = VP8_STATUS_OK;
  }
  else {
    local_4 = local_5c;
  }
  return local_4;
}

Assistant:

static VP8StatusCode ParseHeadersInternal(const uint8_t* data,
                                          size_t data_size,
                                          int* const width,
                                          int* const height,
                                          int* const has_alpha,
                                          int* const has_animation,
                                          int* const format,
                                          WebPHeaderStructure* const headers) {
  int canvas_width = 0;
  int canvas_height = 0;
  int image_width = 0;
  int image_height = 0;
  int found_riff = 0;
  int found_vp8x = 0;
  int animation_present = 0;
  const int have_all_data = (headers != NULL) ? headers->have_all_data : 0;

  VP8StatusCode status;
  WebPHeaderStructure hdrs;

  if (data == NULL || data_size < RIFF_HEADER_SIZE) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  memset(&hdrs, 0, sizeof(hdrs));
  hdrs.data = data;
  hdrs.data_size = data_size;

  // Skip over RIFF header.
  status = ParseRIFF(&data, &data_size, have_all_data, &hdrs.riff_size);
  if (status != VP8_STATUS_OK) {
    return status;   // Wrong RIFF header / insufficient data.
  }
  found_riff = (hdrs.riff_size > 0);

  // Skip over VP8X.
  {
    uint32_t flags = 0;
    status = ParseVP8X(&data, &data_size, &found_vp8x,
                       &canvas_width, &canvas_height, &flags);
    if (status != VP8_STATUS_OK) {
      return status;  // Wrong VP8X / insufficient data.
    }
    animation_present = !!(flags & ANIMATION_FLAG);
    if (!found_riff && found_vp8x) {
      // Note: This restriction may be removed in the future, if it becomes
      // necessary to send VP8X chunk to the decoder.
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (has_alpha != NULL) *has_alpha = !!(flags & ALPHA_FLAG);
    if (has_animation != NULL) *has_animation = animation_present;
    if (format != NULL) *format = 0;   // default = undefined

    image_width = canvas_width;
    image_height = canvas_height;
    if (found_vp8x && animation_present && headers == NULL) {
      status = VP8_STATUS_OK;
      goto ReturnWidthHeight;  // Just return features from VP8X header.
    }
  }

  if (data_size < TAG_SIZE) {
    status = VP8_STATUS_NOT_ENOUGH_DATA;
    goto ReturnWidthHeight;
  }

  // Skip over optional chunks if data started with "RIFF + VP8X" or "ALPH".
  if ((found_riff && found_vp8x) ||
      (!found_riff && !found_vp8x && !memcmp(data, "ALPH", TAG_SIZE))) {
    status = ParseOptionalChunks(&data, &data_size, hdrs.riff_size,
                                 &hdrs.alpha_data, &hdrs.alpha_data_size);
    if (status != VP8_STATUS_OK) {
      goto ReturnWidthHeight;  // Invalid chunk size / insufficient data.
    }
  }

  // Skip over VP8/VP8L header.
  status = ParseVP8Header(&data, &data_size, have_all_data, hdrs.riff_size,
                          &hdrs.compressed_size, &hdrs.is_lossless);
  if (status != VP8_STATUS_OK) {
    goto ReturnWidthHeight;  // Wrong VP8/VP8L chunk-header / insufficient data.
  }
  if (hdrs.compressed_size > MAX_CHUNK_PAYLOAD) {
    return VP8_STATUS_BITSTREAM_ERROR;
  }

  if (format != NULL && !animation_present) {
    *format = hdrs.is_lossless ? 2 : 1;
  }

  if (!hdrs.is_lossless) {
    if (data_size < VP8_FRAME_HEADER_SIZE) {
      status = VP8_STATUS_NOT_ENOUGH_DATA;
      goto ReturnWidthHeight;
    }
    // Validates raw VP8 data.
    if (!VP8GetInfo(data, data_size, (uint32_t)hdrs.compressed_size,
                    &image_width, &image_height)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  } else {
    if (data_size < VP8L_FRAME_HEADER_SIZE) {
      status = VP8_STATUS_NOT_ENOUGH_DATA;
      goto ReturnWidthHeight;
    }
    // Validates raw VP8L data.
    if (!VP8LGetInfo(data, data_size, &image_width, &image_height, has_alpha)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  // Validates image size coherency.
  if (found_vp8x) {
    if (canvas_width != image_width || canvas_height != image_height) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  if (headers != NULL) {
    *headers = hdrs;
    headers->offset = data - headers->data;
    assert((uint64_t)(data - headers->data) < MAX_CHUNK_PAYLOAD);
    assert(headers->offset == headers->data_size - data_size);
  }
 ReturnWidthHeight:
  if (status == VP8_STATUS_OK ||
      (status == VP8_STATUS_NOT_ENOUGH_DATA && found_vp8x && headers == NULL)) {
    if (has_alpha != NULL) {
      // If the data did not contain a VP8X/VP8L chunk the only definitive way
      // to set this is by looking for alpha data (from an ALPH chunk).
      *has_alpha |= (hdrs.alpha_data != NULL);
    }
    if (width != NULL) *width = image_width;
    if (height != NULL) *height = image_height;
    return VP8_STATUS_OK;
  } else {
    return status;
  }
}